

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<TPZManVector<double,_10>,_20> * __thiscall
TPZManVector<TPZManVector<double,_10>,_20>::operator=
          (TPZManVector<TPZManVector<double,_10>,_20> *this,
          TPZManVector<TPZManVector<double,_10>,_20> *rval)

{
  long lVar1;
  double dVar2;
  TPZManVector<double,_10> *pTVar3;
  TPZManVector<double,_10> *this_00;
  long lVar4;
  long lVar5;
  TPZManVector<double,_10> *pTVar6;
  bool bVar7;
  TPZManVector<double,_10> local_a0;
  
  if (this != rval) {
    lVar1 = (rval->super_TPZVec<TPZManVector<double,_10>_>).fNElements;
    pTVar6 = (this->super_TPZVec<TPZManVector<double,_10>_>).fStore;
    pTVar3 = this->fExtAlloc;
    if (pTVar6 != pTVar3 && pTVar6 != (TPZManVector<double,_10> *)0x0) {
      dVar2 = pTVar6[-1].fExtAlloc[9];
      if (dVar2 != 0.0) {
        lVar4 = (long)dVar2 * 0x70;
        do {
          TPZManVector<double,_10>::~TPZManVector
                    ((TPZManVector<double,_10> *)((long)pTVar6[-1].fExtAlloc + lVar4 + -0x20));
          lVar4 = lVar4 + -0x70;
        } while (lVar4 != 0);
      }
      operator_delete__(pTVar6[-1].fExtAlloc + 9,(long)dVar2 * 0x70 | 8);
      (this->super_TPZVec<TPZManVector<double,_10>_>).fStore = (TPZManVector<double,_10> *)0x0;
      (this->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = 0;
    }
    if (lVar1 < 0x15) {
      pTVar6 = rval->fExtAlloc;
      lVar5 = 0;
      lVar4 = 0;
      if (0 < lVar1) {
        lVar4 = lVar1;
      }
      this_00 = pTVar3;
      for (; -lVar5 != lVar4; lVar5 = lVar5 + -1) {
        TPZManVector<double,_10>::operator=(this_00,pTVar6);
        pTVar6 = pTVar6 + 1;
        this_00 = this_00 + 1;
      }
      lVar5 = (ulong)(uint)((0x14 - (int)lVar4) - (int)lVar5) - lVar4;
      pTVar6 = this->fExtAlloc + lVar4;
      lVar4 = 0;
      while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
        TPZManVector<double,_10>::TPZManVector(&local_a0,0);
        TPZManVector<double,_10>::operator=(pTVar6,&local_a0);
        TPZManVector<double,_10>::~TPZManVector(&local_a0);
        pTVar6 = pTVar6 + 1;
      }
    }
    else {
      pTVar3 = (rval->super_TPZVec<TPZManVector<double,_10>_>).fStore;
      lVar4 = lVar1;
    }
    (this->super_TPZVec<TPZManVector<double,_10>_>).fStore = pTVar3;
    (this->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = lVar4;
    (this->super_TPZVec<TPZManVector<double,_10>_>).fNElements = lVar1;
  }
  (rval->super_TPZVec<TPZManVector<double,_10>_>).fStore = (TPZManVector<double,_10> *)0x0;
  (rval->super_TPZVec<TPZManVector<double,_10>_>).fNElements = 0;
  (rval->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}